

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_writer.c
# Opt level: O2

void write_header(FILE *file,AvxVideoInfo *info,int frame_count)

{
  aom_codec_enc_cfg aStack_388;
  
  aStack_388.g_w = info->frame_width;
  aStack_388.g_h = info->frame_height;
  aStack_388.g_timebase.num = (info->time_base).numerator;
  aStack_388.g_timebase.den = (info->time_base).denominator;
  ivf_write_file_header(file,&aStack_388,info->codec_fourcc,frame_count);
  return;
}

Assistant:

static void write_header(FILE *file, const AvxVideoInfo *info,
                         int frame_count) {
  struct aom_codec_enc_cfg cfg;
  cfg.g_w = info->frame_width;
  cfg.g_h = info->frame_height;
  cfg.g_timebase.num = info->time_base.numerator;
  cfg.g_timebase.den = info->time_base.denominator;

  ivf_write_file_header(file, &cfg, info->codec_fourcc, frame_count);
}